

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall Utf8Decode_ImpossibleBytes_Test::TestBody(Utf8Decode_ImpossibleBytes_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  allocator<unsigned_char> local_10d;
  uchar local_10c [4];
  iterator local_108;
  size_type local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  cpstring local_e0;
  allocator<unsigned_char> local_ba;
  uchar local_b9;
  iterator local_b8;
  size_type local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  cpstring local_90;
  allocator<unsigned_char> local_5a;
  uchar local_59;
  iterator local_58;
  size_type local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  cpstring local_30;
  Utf8Decode_ImpossibleBytes_Test *local_10;
  Utf8Decode_ImpossibleBytes_Test *this_local;
  
  local_59 = 0xfe;
  local_58 = &local_59;
  local_50 = 1;
  local_10 = this;
  std::allocator<unsigned_char>::allocator(&local_5a);
  __l_01._M_len = local_50;
  __l_01._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48,__l_01,&local_5a);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_30,this,&local_48);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
  std::allocator<unsigned_char>::~allocator(&local_5a);
  local_b9 = 0xff;
  local_b8 = &local_b9;
  local_b0 = 1;
  std::allocator<unsigned_char>::allocator(&local_ba);
  __l_00._M_len = local_b0;
  __l_00._M_array = local_b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a8,__l_00,&local_ba);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_90,this,&local_a8);
  std::__cxx11::u32string::~u32string((u32string *)&local_90);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a8);
  std::allocator<unsigned_char>::~allocator(&local_ba);
  local_10c[0] = 0xfe;
  local_10c[1] = 0xfe;
  local_10c[2] = 0xff;
  local_10c[3] = 0xff;
  local_108 = local_10c;
  local_100 = 4;
  std::allocator<unsigned_char>::allocator(&local_10d);
  __l._M_len = local_100;
  __l._M_array = local_108;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_f8,__l,&local_10d);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_e0,this,&local_f8);
  std::__cxx11::u32string::~u32string((u32string *)&local_e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_f8);
  std::allocator<unsigned_char>::~allocator(&local_10d);
  return;
}

Assistant:

TEST_F (Utf8Decode, ImpossibleBytes) {
    decode_bad (bytes ({0xFE}));
    decode_bad (bytes ({0xFF}));
    decode_bad (bytes ({0xFE, 0xFE, 0xFF, 0xFF}));
}